

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O1

bool __thiscall tinyxml2::XMLElement::Accept(XMLElement *this,XMLVisitor *visitor)

{
  int iVar1;
  XMLNode *pXVar2;
  
  iVar1 = (*visitor->_vptr_XMLVisitor[4])(visitor,this,this->_rootAttribute);
  pXVar2 = (this->super_XMLNode)._firstChild;
  if ((pXVar2 != (XMLNode *)0x0 & (byte)iVar1) == 1) {
    do {
      iVar1 = (*pXVar2->_vptr_XMLNode[0xe])(pXVar2,visitor);
      if ((char)iVar1 == '\0') break;
      pXVar2 = pXVar2->_next;
    } while (pXVar2 != (XMLNode *)0x0);
  }
  iVar1 = (*visitor->_vptr_XMLVisitor[5])(visitor,this);
  return SUB41(iVar1,0);
}

Assistant:

bool XMLElement::Accept( XMLVisitor* visitor ) const
{
    TIXMLASSERT( visitor );
    if ( visitor->VisitEnter( *this, _rootAttribute ) ) {
        for ( const XMLNode* node=FirstChild(); node; node=node->NextSibling() ) {
            if ( !node->Accept( visitor ) ) {
                break;
            }
        }
    }
    return visitor->VisitExit( *this );
}